

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regcomp.c
# Opt level: O1

void p_ere(parse *p,int stop)

{
  byte *pbVar1;
  int *piVar2;
  size_t opnd;
  byte bVar3;
  long pos;
  byte *pbVar4;
  byte *pbVar5;
  size_t sVar6;
  long lVar7;
  char *pcVar8;
  re_guts *prVar9;
  bool bVar10;
  int from;
  int to;
  ushort **ppuVar11;
  char *pcVar12;
  sop opnd_00;
  long lVar13;
  sop op;
  bool bVar14;
  long local_48;
  long local_40;
  
  bVar10 = false;
  do {
    pos = p->slen;
    while( true ) {
      pbVar4 = (byte *)p->next;
      pbVar5 = (byte *)p->end;
      if (((pbVar5 <= pbVar4) || ((char)*pbVar4 == 0x7c)) || ((char)*pbVar4 == stop)) break;
      pbVar1 = pbVar4 + 1;
      p->next = (char *)pbVar1;
      bVar3 = *pbVar4;
      lVar13 = p->slen;
      if (0x3e < bVar3) {
        if (bVar3 < 0x5e) {
          if (bVar3 == 0x3f) goto switchD_00103bc8_caseD_2a;
          if (bVar3 == 0x5b) {
            p_bracket(p);
            goto LAB_00103d6c;
          }
          if (bVar3 != 0x5c) goto switchD_00103bc8_caseD_25;
          if (pbVar5 <= pbVar1) {
            if (p->error == 0) {
              p->error = 5;
            }
            p->next = nuls;
            p->end = nuls;
          }
          pbVar4 = (byte *)p->next;
          p->next = (char *)(pbVar4 + 1);
          bVar3 = *pbVar4;
LAB_00103d64:
          ordinary(p,(int)(char)bVar3);
          goto LAB_00103d6c;
        }
        if (bVar3 != 0x5e) {
          if (bVar3 == 0x7b) {
            if ((pbVar1 < pbVar5) &&
               (ppuVar11 = __ctype_b_loc(),
               (*(byte *)((long)*ppuVar11 + (long)(char)*pbVar1 * 2 + 1) & 8) != 0)) {
              if (p->error == 0) {
                p->error = 0xd;
              }
              p->next = nuls;
              p->end = nuls;
            }
          }
          else if (bVar3 == 0x7c) {
            if (p->error == 0) {
              p->error = 0xe;
            }
            goto LAB_00103d10;
          }
          goto switchD_00103bc8_caseD_25;
        }
        bVar14 = false;
        doemit(p,0xc000000,0);
        prVar9 = p->g;
        piVar2 = &prVar9->iflags;
        *piVar2 = *piVar2 | 1;
        piVar2 = &prVar9->nbol;
        *piVar2 = *piVar2 + 1;
        goto LAB_00103d6f;
      }
      switch(bVar3) {
      case 0x24:
        doemit(p,0x10000000,0);
        prVar9 = p->g;
        piVar2 = &prVar9->iflags;
        *piVar2 = *piVar2 | 2;
        piVar2 = &prVar9->neol;
        *piVar2 = *piVar2 + 1;
        break;
      default:
switchD_00103bc8_caseD_25:
        goto LAB_00103d64;
      case 0x28:
        if (pbVar5 <= pbVar1) {
          if (p->error == 0) {
            p->error = 8;
          }
          p->next = nuls;
          p->end = nuls;
        }
        sVar6 = p->g->nsub;
        opnd = sVar6 + 1;
        p->g->nsub = opnd;
        if ((long)opnd < 10) {
          p->pbegin[sVar6 + 1] = lVar13;
        }
        doemit(p,0x34000000,opnd);
        if ((p->end <= p->next) || (*p->next != ')')) {
          p_ere(p,0x29);
        }
        if (((long)opnd < 10) && (lVar7 = p->slen, p->pend[sVar6 + 1] = lVar7, lVar7 == 0)) {
          __assert_fail("p->pend[subno] != 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/garyhouston[P]rxspencer/regcomp.c"
                        ,0x11f,"void p_ere_exp()");
        }
        doemit(p,0x38000000,opnd);
        pcVar12 = p->next;
        if (pcVar12 < p->end) {
          p->next = pcVar12 + 1;
          bVar14 = true;
          if (*pcVar12 == ')') goto LAB_00103d6f;
        }
        if (p->error == 0) {
          p->error = 8;
        }
        goto LAB_00103d10;
      case 0x2a:
      case 0x2b:
switchD_00103bc8_caseD_2a:
        if (p->error == 0) {
          p->error = 0xd;
        }
LAB_00103d10:
        p->next = nuls;
        p->end = nuls;
        break;
      case 0x2e:
        if ((p->g->cflags & 8) == 0) {
          doemit(p,0x14000000,0);
        }
        else {
          nonnewline(p);
        }
      }
LAB_00103d6c:
      bVar14 = true;
LAB_00103d6f:
      pbVar4 = (byte *)p->next;
      if ((pbVar4 < p->end) &&
         (((bVar3 = *pbVar4, bVar3 - 0x2a < 2 || (bVar3 == 0x3f)) ||
          ((bVar3 == 0x7b &&
           ((pbVar4 + 1 < p->end &&
            (ppuVar11 = __ctype_b_loc(),
            (*(byte *)((long)*ppuVar11 + (long)(char)pbVar4[1] * 2 + 1) & 8) != 0)))))))) {
        p->next = (char *)(pbVar4 + 1);
        if (!bVar14) {
          if (p->error == 0) {
            p->error = 0xd;
          }
          p->next = nuls;
          p->end = nuls;
        }
        if (bVar3 < 0x3f) {
          if (bVar3 == 0x2a) {
            doinsert(p,0x24000000,(p->slen - lVar13) + 1,lVar13);
            doemit(p,0x28000000,p->slen - lVar13);
            doinsert(p,0x2c000000,(p->slen - lVar13) + 1,lVar13);
            opnd_00 = p->slen - lVar13;
            op = 0x30000000;
          }
          else {
            if (bVar3 != 0x2b) goto LAB_00103fd5;
            doinsert(p,0x24000000,(p->slen - lVar13) + 1,lVar13);
            opnd_00 = p->slen - lVar13;
            op = 0x28000000;
          }
LAB_00103fcd:
          doemit(p,op,opnd_00);
        }
        else {
          if (bVar3 == 0x3f) {
            doinsert(p,0x3c000000,(p->slen - lVar13) + 1,lVar13);
            doemit(p,0x40000000,p->slen - lVar13);
            dofwd(p,lVar13,p->slen - lVar13);
            doemit(p,0x44000000,0);
            if (p->error == 0) {
              p->strip[p->slen + -1] = (ulong)((uint)p->strip[p->slen + -1] & 0x7c000000) + 1;
            }
            op = 0x48000000;
            opnd_00 = 2;
            goto LAB_00103fcd;
          }
          if (bVar3 == 0x7b) {
            from = p_count(p);
            pcVar12 = p->next;
            to = from;
            if ((pcVar12 < p->end) && (*pcVar12 == ',')) {
              p->next = pcVar12 + 1;
              ppuVar11 = __ctype_b_loc();
              to = 0x100;
              if (((*(byte *)((long)*ppuVar11 + (long)pcVar12[1] * 2 + 1) & 8) != 0) &&
                 (to = p_count(p), to < from)) {
                if (p->error == 0) {
                  p->error = 10;
                }
                p->next = nuls;
                p->end = nuls;
              }
            }
            repeat(p,lVar13,from,to);
            pcVar12 = p->next;
            pcVar8 = p->end;
            if ((pcVar12 < pcVar8) && (*pcVar12 == '}')) {
              p->next = pcVar12 + 1;
            }
            else {
              pcVar12 = p->next;
              bVar14 = pcVar12 < pcVar8;
              if (bVar14) {
                if (*pcVar12 != '}') {
                  do {
                    pcVar12 = pcVar12 + 1;
                    p->next = pcVar12;
                    if (pcVar12 == pcVar8) goto LAB_00104078;
                  } while (*pcVar12 != '}');
                  bVar14 = pcVar12 < pcVar8;
                }
                if (!bVar14) goto LAB_00104078;
              }
              else {
LAB_00104078:
                if (p->error == 0) {
                  p->error = 9;
                }
                p->next = nuls;
                p->end = nuls;
              }
              if (p->error == 0) {
                p->error = 10;
              }
              p->next = nuls;
              p->end = nuls;
            }
          }
        }
LAB_00103fd5:
        pbVar4 = (byte *)p->next;
        if ((pbVar4 < p->end) &&
           (((bVar3 = *pbVar4, bVar3 - 0x2a < 2 || (bVar3 == 0x3f)) ||
            ((bVar3 == 0x7b &&
             ((pbVar4 + 1 < p->end &&
              (ppuVar11 = __ctype_b_loc(),
              (*(byte *)((long)*ppuVar11 + (long)(char)pbVar4[1] * 2 + 1) & 8) != 0)))))))) {
          if (p->error == 0) {
            p->error = 0xd;
          }
          p->next = nuls;
          p->end = nuls;
        }
      }
    }
    lVar13 = p->slen - pos;
    if (lVar13 == 0) {
      if (p->error == 0) {
        p->error = 0xe;
      }
      p->next = nuls;
      p->end = nuls;
    }
    pcVar12 = p->next;
    if ((p->end <= pcVar12) || (*pcVar12 != '|')) {
      if (bVar10) {
        dofwd(p,local_40,p->slen - local_40);
        doemit(p,0x48000000,p->slen - local_48);
      }
      if ((p->next < p->end) && (*p->next != stop)) {
        __assert_fail("!MORE() || SEE(stop)",
                      "/workspace/llm4binary/github/license_c_cmakelists/garyhouston[P]rxspencer/regcomp.c"
                      ,0xfe,"void p_ere()");
      }
      return;
    }
    p->next = pcVar12 + 1;
    if (!bVar10) {
      doinsert(p,0x3c000000,lVar13 + 1,pos);
      local_48 = pos;
      local_40 = pos;
    }
    doemit(p,0x40000000,p->slen - local_48);
    local_48 = p->slen + -1;
    dofwd(p,local_40,p->slen - local_40);
    local_40 = p->slen;
    doemit(p,0x44000000,0);
    bVar10 = true;
  } while( true );
}

Assistant:

static void
p_ere(p, stop)
struct parse *p;
int stop;			/* character this ERE should end at */
{
	char c;
	sopno prevback;
	sopno prevfwd;
	sopno conc;
	int first = 1;		/* is this the first alternative? */

	for (;;) {
		/* do a bunch of concatenated expressions */
		conc = HERE();
		while (MORE() && (c = PEEK()) != '|' && c != stop)
			p_ere_exp(p);
		REQUIRE(HERE() != conc, REG_EMPTY);	/* require nonempty */

		if (!EAT('|'))
			break;		/* NOTE BREAK OUT */

		if (first) {
			INSERT(OCH_, conc);	/* offset is wrong */
			prevfwd = conc;
			prevback = conc;
			first = 0;
		}
		ASTERN(OOR1, prevback);
		prevback = THERE();
		AHEAD(prevfwd);			/* fix previous offset */
		prevfwd = HERE();
		EMIT(OOR2, 0);			/* offset is very wrong */
	}

	if (!first) {		/* tail-end fixups */
		AHEAD(prevfwd);
		ASTERN(O_CH, prevback);
	}

	assert(!MORE() || SEE(stop));
}